

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserNumber.cpp
# Opt level: O2

bool __thiscall
Rml::PropertyParserNumber::ParseValue
          (PropertyParserNumber *this,Property *property,String *value,ParameterMap *param_3)

{
  byte bVar1;
  Unit UVar2;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  PropertyParserNumberData *pPVar3;
  size_type sVar4;
  size_type sVar5;
  bool bVar6;
  float fVar7;
  const_iterator cVar8;
  float float_value;
  float local_bc;
  String str_number;
  char *str_end;
  String local_90;
  String str_unit;
  Variant local_50;
  
  sVar4 = value->_M_string_length;
  do {
    sVar5 = sVar4 - 1;
    if ((sVar4 == 0) || (bVar1 = (value->_M_dataplus)._M_p[sVar4 - 1], (byte)(bVar1 - 0x30) < 10))
    break;
    sVar4 = sVar5;
  } while ((0x20 < bVar1) || ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0));
  ::std::__cxx11::string::substr((ulong)&str_number,(ulong)value);
  ::std::__cxx11::string::substr((ulong)&local_90,(ulong)value);
  StringUtilities::ToLower(&str_unit,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  str_end = (char *)0x0;
  fVar7 = strtof(str_number._M_dataplus._M_p,&str_end);
  float_value = fVar7;
  if (str_number._M_dataplus._M_p != str_end) {
    this_00 = &ControlledLifetimeResource<Rml::PropertyParserNumberData>::operator->
                         ((ControlledLifetimeResource<Rml::PropertyParserNumberData> *)&parser_data)
               ->unit_string_map;
    cVar8 = robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(this_00,&str_unit);
    pPVar3 = ControlledLifetimeResource<Rml::PropertyParserNumberData>::operator->
                       ((ControlledLifetimeResource<Rml::PropertyParserNumberData> *)&parser_data);
    if (cVar8.mKeyVals != (NodePtr)(pPVar3->unit_string_map).mInfo) {
      UVar2 = ((cVar8.mKeyVals)->mData).second;
      if ((this->units & UVar2) == UNKNOWN) {
        if (UVar2 != NUMBER) goto LAB_002b8b11;
        bVar6 = false;
        if (((this->zero_unit == UNKNOWN) || (bVar6 = false, fVar7 != 0.0)) || (NAN(fVar7)))
        goto LAB_002b8b13;
        property->unit = this->zero_unit;
        local_bc = 0.0;
        Variant::Variant<float,void>(&local_50,&local_bc);
        Variant::operator=(&property->value,&local_50);
        Variant::~Variant(&local_50);
      }
      else {
        Variant::operator=(&property->value,&float_value);
        property->unit = UVar2;
      }
      bVar6 = true;
      goto LAB_002b8b13;
    }
  }
LAB_002b8b11:
  bVar6 = false;
LAB_002b8b13:
  ::std::__cxx11::string::~string((string *)&str_unit);
  ::std::__cxx11::string::~string((string *)&str_number);
  return bVar6;
}

Assistant:

bool PropertyParserNumber::ParseValue(Property& property, const String& value, const ParameterMap& /*parameters*/) const
{
	// Find the beginning of the unit string in 'value'.
	size_t unit_pos = 0;
	for (size_t i = value.size(); i--;)
	{
		const char c = value[i];
		if ((c >= '0' && c <= '9') || StringUtilities::IsWhitespace(c))
		{
			unit_pos = i + 1;
			break;
		}
	}

	String str_number = value.substr(0, unit_pos);
	String str_unit = StringUtilities::ToLower(value.substr(unit_pos));

	char* str_end = nullptr;
	float float_value = strtof(str_number.c_str(), &str_end);
	if (str_number.c_str() == str_end)
	{
		// Number conversion failed
		return false;
	}

	const auto it = parser_data->unit_string_map.find(str_unit);
	if (it == parser_data->unit_string_map.end())
	{
		// Invalid unit name
		return false;
	}

	const Unit unit = it->second;

	if (Any(unit & units))
	{
		property.value = float_value;
		property.unit = unit;
		return true;
	}

	// Detected unit not allowed.
	// However, we allow a value of "0" if zero_unit is set and no unit specified (that is, unit is a pure NUMBER).
	if (unit == Unit::NUMBER)
	{
		if (zero_unit != Unit::UNKNOWN && float_value == 0.0f)
		{
			property.unit = zero_unit;
			property.value = Variant(0.0f);
			return true;
		}
	}

	return false;
}